

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XDisassembler.c
# Opt level: O1

void direct_hdlr(MCInst *MI,m680x_info *info,uint16_t *address)

{
  cs_m680x_op *op;
  byte bVar1;
  ushort uVar2;
  long lVar3;
  
  bVar1 = (info->m680x).op_count;
  (info->m680x).op_count = bVar1 + 1;
  op = (info->m680x).operands + bVar1;
  op->type = M680X_OP_DIRECT;
  set_operand_size(info,op,(uint8_t)address);
  uVar2 = *address;
  *address = uVar2 + 1;
  lVar3 = (ulong)uVar2 - (ulong)info->offset;
  if ((uint)lVar3 < info->size) {
    (op->field_1).direct_addr = info->code[lVar3];
  }
  return;
}

Assistant:

static void direct_hdlr(MCInst *MI, m680x_info *info, uint16_t *address)
{
	cs_m680x *m680x = &info->m680x;
	cs_m680x_op *op = &m680x->operands[m680x->op_count++];

	op->type = M680X_OP_DIRECT;
	set_operand_size(info, op, 1);
	read_byte(info, &op->direct_addr, (*address)++);
}